

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

Bool tidyNodeGetValue(TidyDoc tdoc,TidyNode tnod,TidyBuffer *buf)

{
  Bool BVar1;
  
  BVar1 = no;
  if (((buf != (TidyBuffer *)0x0 && (tnod != (TidyNode)0x0 && tdoc != (TidyDoc)0x0)) &&
      ((uint)tnod[0x14]._opaque < 0xd)) && ((0x1f1cU >> (tnod[0x14]._opaque & 0x1fU) & 1) != 0)) {
    tidyBufClear(buf);
    tidyBufAppend(buf,(void *)((ulong)(uint)tnod[0x12]._opaque +
                              *(long *)(*(long *)(tdoc + 0x1a) + 0x68)),
                  tnod[0x13]._opaque - tnod[0x12]._opaque);
    BVar1 = yes;
  }
  return BVar1;
}

Assistant:

Bool TIDY_CALL tidyNodeGetValue( TidyDoc tdoc, TidyNode tnod, TidyBuffer* buf )
{
    TidyDocImpl *doc = tidyDocToImpl( tdoc );
    Node *node = tidyNodeToImpl( tnod );
    if ( doc == NULL || node == NULL || buf == NULL )
        return no;

    switch( node->type ) {
    case TextNode:
    case CDATATag:
    case CommentTag:
    case ProcInsTag:
    case SectionTag:
    case AspTag:
    case JsteTag:
    case PhpTag:
    {
        tidyBufClear( buf );
        tidyBufAppend( buf, doc->lexer->lexbuf + node->start,
                       node->end - node->start );
        break;
    }
    default:
        /* The node doesn't have a value */
        return no;
    }

    return yes;
}